

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_IF_Spline.H
# Opt level: O0

void __thiscall
amrex::EB2::SplineIF::addSplineElement
          (SplineIF *this,vector<amrex::RealVect,_std::allocator<amrex::RealVect>_> *pts)

{
  vector<amrex::distFcnElement2d_*,_std::allocator<amrex::distFcnElement2d_*>_> *this_00;
  vector<amrex::RealVect,_std::allocator<amrex::RealVect>_> *in_RSI;
  SplineDistFcnElement2d *theSpline;
  bool in_stack_0000012f;
  SplineDistFcnElement2d *in_stack_00000130;
  value_type *in_stack_ffffffffffffff88;
  SplineDistFcnElement2d *in_stack_ffffffffffffff90;
  vector<amrex::RealVect,_std::allocator<amrex::RealVect>_> *in_stack_ffffffffffffffb8;
  SplineDistFcnElement2d *in_stack_ffffffffffffffc0;
  vector<amrex::RealVect,_std::allocator<amrex::RealVect>_> *in_stack_ffffffffffffffd8;
  vector<amrex::RealVect,_std::allocator<amrex::RealVect>_> *in_stack_ffffffffffffffe0;
  
  this_00 = (vector<amrex::distFcnElement2d_*,_std::allocator<amrex::distFcnElement2d_*>_> *)
            operator_new(0x98);
  SplineDistFcnElement2d::SplineDistFcnElement2d(in_stack_ffffffffffffff90);
  std::vector<amrex::RealVect,_std::allocator<amrex::RealVect>_>::vector
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  SplineDistFcnElement2d::set_control_points(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::vector<amrex::RealVect,_std::allocator<amrex::RealVect>_>::~vector(in_RSI);
  SplineDistFcnElement2d::calc_D(in_stack_00000130,in_stack_0000012f);
  std::vector<amrex::distFcnElement2d_*,_std::allocator<amrex::distFcnElement2d_*>_>::push_back
            (this_00,in_stack_ffffffffffffff88);
  return;
}

Assistant:

void addSplineElement(std::vector<amrex::RealVect> pts) {
    SplineDistFcnElement2d * theSpline = new SplineDistFcnElement2d();
    theSpline->set_control_points(pts);
    theSpline->calc_D();
    geomElements.push_back(theSpline);
  }